

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_extra_field_api.c
# Opt level: O0

zip_uint8_t *
zip_file_extra_field_get
          (zip_t *za,zip_uint64_t idx,zip_uint16_t ef_idx,zip_uint16_t *idp,zip_uint16_t *lenp,
          zip_flags_t flags)

{
  int iVar1;
  zip_dirent_t *pzVar2;
  int local_54;
  zip_extra_field_t *pzStack_50;
  int i;
  zip_extra_field_t *ef;
  zip_dirent_t *de;
  zip_flags_t flags_local;
  zip_uint16_t *lenp_local;
  zip_uint16_t *idp_local;
  zip_uint16_t ef_idx_local;
  zip_uint64_t idx_local;
  zip_t *za_local;
  
  if ((flags & 0x300) == 0) {
    zip_error_set(&za->error,0x12,0);
  }
  else {
    pzVar2 = _zip_get_dirent(za,idx,flags,&za->error);
    if ((pzVar2 != (zip_dirent_t *)0x0) &&
       (((flags & 0x100) == 0 || (iVar1 = _zip_read_local_ef(za,idx), -1 < iVar1)))) {
      local_54 = 0;
      for (pzStack_50 = pzVar2->extra_fields; pzStack_50 != (zip_extra_field_t *)0x0;
          pzStack_50 = pzStack_50->next) {
        if ((pzStack_50->flags & flags & 0x300) != 0) {
          if ((int)(uint)ef_idx <= local_54) {
            if (idp != (zip_uint16_t *)0x0) {
              *idp = pzStack_50->id;
            }
            if (lenp != (zip_uint16_t *)0x0) {
              *lenp = pzStack_50->size;
            }
            if (pzStack_50->size == 0) {
              za_local = (zip_t *)zip_file_extra_field_get::empty;
              return (zip_uint8_t *)za_local;
            }
            return pzStack_50->data;
          }
          local_54 = local_54 + 1;
        }
      }
      zip_error_set(&za->error,9,0);
    }
  }
  return (zip_uint8_t *)0x0;
}

Assistant:

ZIP_EXTERN const zip_uint8_t *
zip_file_extra_field_get(zip_t *za, zip_uint64_t idx, zip_uint16_t ef_idx, zip_uint16_t *idp, zip_uint16_t *lenp, zip_flags_t flags) {
    static const zip_uint8_t empty[1] = {'\0'};

    zip_dirent_t *de;
    zip_extra_field_t *ef;
    int i;

    if ((flags & ZIP_EF_BOTH) == 0) {
	zip_error_set(&za->error, ZIP_ER_INVAL, 0);
	return NULL;
    }

    if ((de = _zip_get_dirent(za, idx, flags, &za->error)) == NULL)
	return NULL;

    if (flags & ZIP_FL_LOCAL)
	if (_zip_read_local_ef(za, idx) < 0)
	    return NULL;

    i = 0;
    for (ef = de->extra_fields; ef; ef = ef->next) {
	if (ef->flags & flags & ZIP_EF_BOTH) {
	    if (i < ef_idx) {
		i++;
		continue;
	    }

	    if (idp)
		*idp = ef->id;
	    if (lenp)
		*lenp = ef->size;
	    if (ef->size > 0)
		return ef->data;
	    else
		return empty;
	}
    }

    zip_error_set(&za->error, ZIP_ER_NOENT, 0);
    return NULL;
}